

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O0

void __thiscall
wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow
          (StringifyWalker<wasm::ReconstructStringifyWalker> *this)

{
  Id IVar1;
  Expression *this_00;
  SeparatorReason reason;
  SeparatorReason reason_00;
  SeparatorReason reason_01;
  SeparatorReason reason_02;
  SeparatorReason reason_03;
  SeparatorReason reason_04;
  SeparatorReason reason_05;
  SeparatorReason reason_06;
  SeparatorReason reason_07;
  SeparatorReason reason_08;
  SeparatorReason reason_09;
  bool bVar2;
  queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *this_01;
  reference ppEVar3;
  Block *__return_storage_ptr__;
  If *__return_storage_ptr___00;
  Try *pTVar4;
  Expression **ppEVar5;
  Loop *__return_storage_ptr___01;
  Block *in_RSI;
  _Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  in_stack_fffffffffffffe98;
  Loop *loop;
  Expression **child_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  ExpressionList *__range3_1;
  Try *tryy;
  If *iff;
  Expression **child;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  Block *block;
  Expression *curr;
  queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *queue;
  StringifyWalker<wasm::ReconstructStringifyWalker> *this_local;
  
  this_01 = &this->controlFlowQueue;
  ppEVar3 = std::
            queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ::front(this_01);
  this_00 = *ppEVar3;
  std::
  queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::
  pop(this_01);
  IVar1 = this_00->_id;
  if (IVar1 == BlockId) {
    __return_storage_ptr__ = Expression::cast<wasm::Block>(this_00);
    SeparatorReason::makeBlockStart((SeparatorReason *)__return_storage_ptr__,in_RSI);
    reason.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(__return_storage_ptr__->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                       (&(__return_storage_ptr__->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end3.index,(Iterator *)&child), bVar2) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end3.index);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)this,ppEVar5);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3.index);
    }
    SeparatorReason::makeEnd();
    reason_00.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_00.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_00);
  }
  else if (IVar1 == IfId) {
    __return_storage_ptr___00 = Expression::cast<wasm::If>(this_00);
    SeparatorReason::makeIfStart((SeparatorReason *)__return_storage_ptr___00,(If *)in_RSI);
    reason_01.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_01.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_01);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            *)this,&__return_storage_ptr___00->ifTrue);
    if (__return_storage_ptr___00->ifFalse != (Expression *)0x0) {
      SeparatorReason::makeElseStart();
      reason_02.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._8_8_ = this;
      reason_02.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._M_u = in_stack_fffffffffffffe98;
      addUniqueSymbol(this,reason_02);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)this,&__return_storage_ptr___00->ifFalse);
    }
    SeparatorReason::makeEnd();
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_03);
  }
  else if (IVar1 == LoopId) {
    __return_storage_ptr___01 = Expression::cast<wasm::Loop>(this_00);
    SeparatorReason::makeLoopStart((SeparatorReason *)__return_storage_ptr___01,(Loop *)in_RSI);
    reason_08.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_08.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_08);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            *)this,&__return_storage_ptr___01->body);
    SeparatorReason::makeEnd();
    reason_09.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_09.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_09);
  }
  else {
    if (IVar1 != TryId) {
      bVar2 = Properties::isControlFlowStructure(this_00);
      if (bVar2) {
        handle_unreachable("unexpected expression",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                           ,0x77);
      }
      __assert_fail("Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                    ,0x76,
                    "void wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow() [SubType = wasm::ReconstructStringifyWalker]"
                   );
    }
    pTVar4 = Expression::cast<wasm::Try>(this_00);
    SeparatorReason::makeTryBodyStart();
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_04);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            *)this,&pTVar4->body);
    SeparatorReason::makeEnd();
    reason_05.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = this;
    reason_05.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_fffffffffffffe98;
    addUniqueSymbol(this,reason_05);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pTVar4->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child_1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&(pTVar4->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end3_1.index,(Iterator *)&child_1), bVar2) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end3_1.index);
      SeparatorReason::makeTryCatchStart();
      reason_06.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._8_8_ = this;
      reason_06.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._M_u = in_stack_fffffffffffffe98;
      addUniqueSymbol(this,reason_06);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)this,ppEVar5);
      SeparatorReason::makeEnd();
      reason_07.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._8_8_ = this;
      reason_07.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._M_u = in_stack_fffffffffffffe98;
      addUniqueSymbol(this,reason_07);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3_1.index);
    }
  }
  return;
}

Assistant:

void StringifyWalker<SubType>::dequeueControlFlow() {
  auto& queue = controlFlowQueue;
  Expression* curr = queue.front();
  queue.pop();
  DBG(std::cerr << "controlFlowQueue.pop: " << ShallowExpression{curr} << ", "
                << curr << "\n");

  // TODO: Issue #5796, Make a ControlChildIterator
  switch (curr->_id) {
    case Expression::Id::BlockId: {
      auto* block = curr->cast<Block>();
      addUniqueSymbol(SeparatorReason::makeBlockStart(block));
      for (auto& child : block->list) {
        Super::walk(child);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::IfId: {
      auto* iff = curr->cast<If>();
      addUniqueSymbol(SeparatorReason::makeIfStart(iff));
      Super::walk(iff->ifTrue);
      if (iff->ifFalse) {
        addUniqueSymbol(SeparatorReason::makeElseStart());
        Super::walk(iff->ifFalse);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::TryId: {
      auto* tryy = curr->cast<Try>();
      addUniqueSymbol(SeparatorReason::makeTryBodyStart());
      Super::walk(tryy->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      for (auto& child : tryy->catchBodies) {
        addUniqueSymbol(SeparatorReason::makeTryCatchStart());
        Super::walk(child);
        addUniqueSymbol(SeparatorReason::makeEnd());
      }
      break;
    }
    case Expression::Id::LoopId: {
      auto* loop = curr->cast<Loop>();
      addUniqueSymbol(SeparatorReason::makeLoopStart(loop));
      Super::walk(loop->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    default: {
      assert(Properties::isControlFlowStructure(curr));
      WASM_UNREACHABLE("unexpected expression");
    }
  }
}